

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

int find_branch(char *s,proto_dungeon *pd)

{
  char cVar1;
  branch **ppbVar2;
  int iVar3;
  int iVar4;
  branch *pbVar5;
  long lVar6;
  tmpbranch *__s1;
  
  if (pd == (proto_dungeon *)0x0) {
    pbVar5 = branches;
    if (branches != (branch *)0x0) {
      do {
        cVar1 = (pbVar5->end2).dnum;
        iVar4 = strncasecmp(dungeons[cVar1].dname,s,0xffffffffffffffff);
        if ((iVar4 == 0) ||
           ((iVar4 = strncasecmp(dungeons[cVar1].dname,"The ",4), iVar4 == 0 &&
            (iVar4 = strncasecmp(dungeons[cVar1].dname + 4,s,0xffffffffffffffff), iVar4 == 0)))) {
          return (int)(char)((pbVar5->end2).dlevel + (char)dungeons[cVar1].ledger_start) |
                 (int)(char)((pbVar5->end1).dlevel +
                            (char)dungeons[(pbVar5->end1).dnum].ledger_start) << 8;
        }
        ppbVar2 = &pbVar5->next;
        pbVar5 = *ppbVar2;
      } while (*ppbVar2 != (branch *)0x0);
    }
    return -1;
  }
  iVar4 = pd->n_brs;
  if ((long)iVar4 < 1) {
    lVar6 = 0;
LAB_0018c33a:
    if ((int)lVar6 != iVar4) {
      return (int)lVar6;
    }
  }
  else {
    __s1 = pd->tmpbranch;
    lVar6 = 0;
    do {
      iVar3 = strcmp(__s1->name,s);
      if (iVar3 == 0) goto LAB_0018c33a;
      lVar6 = lVar6 + 1;
      __s1 = __s1 + 1;
    } while (iVar4 != lVar6);
  }
  panic("find_branch: can\'t find %s",s);
}

Assistant:

static int find_branch(const char *s, /* dungeon name */
		       struct proto_dungeon *pd)
{
	int i;

	if (pd) {
	    for (i = 0; i < pd->n_brs; i++)
		if (!strcmp(pd->tmpbranch[i].name, s)) break;
	    if (i == pd->n_brs) panic("find_branch: can't find %s", s);
	} else {
	    /* support for level tport by name */
	    branch *br;
	    const char *dnam;

	    for (br = branches; br; br = br->next) {
		dnam = dungeons[br->end2.dnum].dname;
		if (!strcmpi(dnam, s) ||
			(!strncmpi(dnam, "The ", 4) && !strcmpi(dnam + 4, s)))
		    break;
	    }
	    i = br ? ((ledger_no(&br->end1) << 8) | ledger_no(&br->end2)) : -1;
	}
	return i;
}